

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::evalTexture3DGrad(ShaderEvalContext *c,TexLookupParams *p)

{
  float s;
  float t;
  float r;
  Texture3D *pTVar1;
  int i;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  float local_48 [4];
  undefined8 local_38;
  undefined8 uStack_30;
  tcu local_20 [16];
  
  s = c->in[0].m_data[0];
  pTVar1 = c->textures[0].tex3D;
  t = c->in[0].m_data[1];
  r = c->in[0].m_data[2];
  fVar4 = c->in[1].m_data[0] * (float)pTVar1->m_width;
  fVar5 = c->in[1].m_data[1] * (float)pTVar1->m_height;
  fVar3 = c->in[1].m_data[2] * (float)pTVar1->m_depth;
  fVar7 = (float)pTVar1->m_width * c->in[2].m_data[0];
  fVar8 = (float)pTVar1->m_height * c->in[2].m_data[1];
  fVar6 = (float)pTVar1->m_depth * c->in[2].m_data[2];
  fVar3 = fVar3 * fVar3 + fVar4 * fVar4 + fVar5 * fVar5;
  if (fVar3 < 0.0) {
    fVar3 = sqrtf(fVar3);
  }
  else {
    fVar3 = SQRT(fVar3);
  }
  fVar4 = fVar6 * fVar6 + fVar7 * fVar7 + fVar8 * fVar8;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    fVar4 = SQRT(fVar4);
  }
  fVar3 = logf((float)(~-(uint)(fVar4 <= fVar3) & (uint)fVar4 |
                      (uint)fVar3 & -(uint)(fVar4 <= fVar3)));
  pTVar1 = c->textures[0].tex3D;
  tcu::sampleLevelArray3D
            (local_20,(pTVar1->m_view).m_levels,(pTVar1->m_view).m_numLevels,&c->textures[0].sampler
             ,s,t,r,fVar3 * 1.442695);
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  lVar2 = 0;
  do {
    local_48[lVar2] = *(float *)(local_20 + lVar2 * 4) * (p->scale).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  local_38 = 0;
  uStack_30 = 0;
  lVar2 = 0;
  do {
    *(float *)((long)&local_38 + lVar2 * 4) = local_48[lVar2] + (p->bias).m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  *(undefined8 *)(c->color).m_data = local_38;
  *(undefined8 *)((c->color).m_data + 2) = uStack_30;
  return;
}

Assistant:

static void		evalTexture3DGrad			(ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture3D(c, c.in[0].x(), c.in[0].y(), c.in[0].z(), computeLodFromGrad3D(c))*p.scale + p.bias; }